

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O0

int __thiscall
gl4cts::StandardPageSizesTestCase::init(StandardPageSizesTestCase *this,EVP_PKEY_CTX *ctx)

{
  mapped_type *pmVar1;
  key_type_conflict local_2c4;
  PageSizeStruct local_2c0;
  key_type_conflict local_2b4;
  PageSizeStruct local_2b0;
  key_type_conflict local_2a4;
  PageSizeStruct local_2a0;
  key_type_conflict local_294;
  PageSizeStruct local_290;
  key_type_conflict local_284;
  PageSizeStruct local_280;
  key_type_conflict local_274;
  PageSizeStruct local_270;
  key_type_conflict local_264;
  PageSizeStruct local_260;
  key_type_conflict local_254;
  PageSizeStruct local_250;
  key_type_conflict local_244;
  PageSizeStruct local_240;
  key_type_conflict local_234;
  PageSizeStruct local_230;
  key_type_conflict local_224;
  PageSizeStruct local_220;
  key_type_conflict local_214;
  PageSizeStruct local_210;
  key_type_conflict local_204;
  PageSizeStruct local_200;
  key_type_conflict local_1f4;
  PageSizeStruct local_1f0;
  key_type_conflict local_1e4;
  PageSizeStruct local_1e0;
  key_type_conflict local_1d4;
  PageSizeStruct local_1d0;
  key_type_conflict local_1c4;
  PageSizeStruct local_1c0;
  key_type_conflict local_1b4;
  PageSizeStruct local_1b0;
  key_type_conflict local_1a4;
  PageSizeStruct local_1a0;
  key_type_conflict local_194;
  PageSizeStruct local_190;
  key_type_conflict local_184;
  PageSizeStruct local_180;
  key_type_conflict local_174;
  PageSizeStruct local_170;
  key_type_conflict local_164;
  PageSizeStruct local_160;
  key_type_conflict local_154;
  PageSizeStruct local_150;
  key_type_conflict local_144;
  PageSizeStruct local_140;
  key_type_conflict local_134;
  PageSizeStruct local_130;
  key_type_conflict local_124;
  PageSizeStruct local_120;
  key_type_conflict local_114;
  PageSizeStruct local_110;
  key_type_conflict local_104;
  PageSizeStruct local_100;
  key_type_conflict local_f4;
  PageSizeStruct local_f0;
  key_type_conflict local_e4;
  PageSizeStruct local_e0;
  key_type_conflict local_d4;
  PageSizeStruct local_d0;
  key_type_conflict local_c4;
  PageSizeStruct local_c0;
  key_type_conflict local_b4;
  PageSizeStruct local_b0;
  key_type_conflict local_a4;
  PageSizeStruct local_a0;
  key_type_conflict local_94;
  PageSizeStruct local_90;
  key_type_conflict local_84;
  PageSizeStruct local_80;
  key_type_conflict local_74;
  PageSizeStruct local_70;
  key_type_conflict local_64;
  PageSizeStruct local_60;
  key_type_conflict local_54;
  PageSizeStruct local_50;
  key_type_conflict local_44;
  PageSizeStruct local_40;
  value_type_conflict1 local_34 [9];
  StandardPageSizesTestCase *local_10;
  StandardPageSizesTestCase *this_local;
  
  local_34[8] = 0xde0;
  local_10 = this;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mSupportedTargets,local_34 + 8);
  local_34[7] = 0x8c18;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mSupportedTargets,local_34 + 7);
  local_34[6] = 0xde1;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mSupportedTargets,local_34 + 6);
  local_34[5] = 0x8c1a;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mSupportedTargets,local_34 + 5);
  local_34[4] = 0x8513;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mSupportedTargets,local_34 + 4);
  local_34[3] = 0x9009;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mSupportedTargets,local_34 + 3);
  local_34[2] = 0x84f5;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mSupportedTargets,local_34 + 2);
  local_34[1] = 0x8c2a;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mSupportedTargets,local_34 + 1);
  local_34[0] = 0x8d41;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mSupportedTargets,local_34);
  PageSizeStruct::PageSizeStruct(&local_40,0x100,0x100,1);
  local_44 = 0x8229;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_44);
  pmVar1->xSize = local_40.xSize;
  pmVar1->ySize = local_40.ySize;
  pmVar1->zSize = local_40.zSize;
  PageSizeStruct::PageSizeStruct(&local_50,0x100,0x100,1);
  local_54 = 0x8f94;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_54);
  pmVar1->xSize = local_50.xSize;
  pmVar1->ySize = local_50.ySize;
  pmVar1->zSize = local_50.zSize;
  PageSizeStruct::PageSizeStruct(&local_60,0x100,0x100,1);
  local_64 = 0x8231;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_64);
  pmVar1->xSize = local_60.xSize;
  pmVar1->ySize = local_60.ySize;
  pmVar1->zSize = local_60.zSize;
  PageSizeStruct::PageSizeStruct(&local_70,0x100,0x100,1);
  local_74 = 0x8232;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_74);
  pmVar1->xSize = local_70.xSize;
  pmVar1->ySize = local_70.ySize;
  pmVar1->zSize = local_70.zSize;
  PageSizeStruct::PageSizeStruct(&local_80,0x100,0x80,1);
  local_84 = 0x822a;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_84);
  pmVar1->xSize = local_80.xSize;
  pmVar1->ySize = local_80.ySize;
  pmVar1->zSize = local_80.zSize;
  PageSizeStruct::PageSizeStruct(&local_90,0x100,0x80,1);
  local_94 = 0x8f98;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_94);
  pmVar1->xSize = local_90.xSize;
  pmVar1->ySize = local_90.ySize;
  pmVar1->zSize = local_90.zSize;
  PageSizeStruct::PageSizeStruct(&local_a0,0x100,0x80,1);
  local_a4 = 0x822b;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_a4);
  pmVar1->xSize = local_a0.xSize;
  pmVar1->ySize = local_a0.ySize;
  pmVar1->zSize = local_a0.zSize;
  PageSizeStruct::PageSizeStruct(&local_b0,0x100,0x80,1);
  local_b4 = 0x8f95;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_b4);
  pmVar1->xSize = local_b0.xSize;
  pmVar1->ySize = local_b0.ySize;
  pmVar1->zSize = local_b0.zSize;
  PageSizeStruct::PageSizeStruct(&local_c0,0x100,0x80,1);
  local_c4 = 0x8d62;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_c4);
  pmVar1->xSize = local_c0.xSize;
  pmVar1->ySize = local_c0.ySize;
  pmVar1->zSize = local_c0.zSize;
  PageSizeStruct::PageSizeStruct(&local_d0,0x100,0x80,1);
  local_d4 = 0x822d;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_d4);
  pmVar1->xSize = local_d0.xSize;
  pmVar1->ySize = local_d0.ySize;
  pmVar1->zSize = local_d0.zSize;
  PageSizeStruct::PageSizeStruct(&local_e0,0x100,0x80,1);
  local_e4 = 0x8233;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_e4);
  pmVar1->xSize = local_e0.xSize;
  pmVar1->ySize = local_e0.ySize;
  pmVar1->zSize = local_e0.zSize;
  PageSizeStruct::PageSizeStruct(&local_f0,0x100,0x80,1);
  local_f4 = 0x8234;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_f4);
  pmVar1->xSize = local_f0.xSize;
  pmVar1->ySize = local_f0.ySize;
  pmVar1->zSize = local_f0.zSize;
  PageSizeStruct::PageSizeStruct(&local_100,0x100,0x80,1);
  local_104 = 0x8237;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_104);
  pmVar1->xSize = local_100.xSize;
  pmVar1->ySize = local_100.ySize;
  pmVar1->zSize = local_100.zSize;
  PageSizeStruct::PageSizeStruct(&local_110,0x100,0x80,1);
  local_114 = 0x8238;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_114);
  pmVar1->xSize = local_110.xSize;
  pmVar1->ySize = local_110.ySize;
  pmVar1->zSize = local_110.zSize;
  PageSizeStruct::PageSizeStruct(&local_120,0x80,0x80,1);
  local_124 = 0x822c;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_124);
  pmVar1->xSize = local_120.xSize;
  pmVar1->ySize = local_120.ySize;
  pmVar1->zSize = local_120.zSize;
  PageSizeStruct::PageSizeStruct(&local_130,0x80,0x80,1);
  local_134 = 0x8f99;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_134);
  pmVar1->xSize = local_130.xSize;
  pmVar1->ySize = local_130.ySize;
  pmVar1->zSize = local_130.zSize;
  PageSizeStruct::PageSizeStruct(&local_140,0x80,0x80,1);
  local_144 = 0x8058;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_144);
  pmVar1->xSize = local_140.xSize;
  pmVar1->ySize = local_140.ySize;
  pmVar1->zSize = local_140.zSize;
  PageSizeStruct::PageSizeStruct(&local_150,0x80,0x80,1);
  local_154 = 0x8f97;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_154);
  pmVar1->xSize = local_150.xSize;
  pmVar1->ySize = local_150.ySize;
  pmVar1->zSize = local_150.zSize;
  PageSizeStruct::PageSizeStruct(&local_160,0x80,0x80,1);
  local_164 = 0x8059;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_164);
  pmVar1->xSize = local_160.xSize;
  pmVar1->ySize = local_160.ySize;
  pmVar1->zSize = local_160.zSize;
  PageSizeStruct::PageSizeStruct(&local_170,0x80,0x80,1);
  local_174 = 0x906f;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_174);
  pmVar1->xSize = local_170.xSize;
  pmVar1->ySize = local_170.ySize;
  pmVar1->zSize = local_170.zSize;
  PageSizeStruct::PageSizeStruct(&local_180,0x80,0x80,1);
  local_184 = 0x822f;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_184);
  pmVar1->xSize = local_180.xSize;
  pmVar1->ySize = local_180.ySize;
  pmVar1->zSize = local_180.zSize;
  PageSizeStruct::PageSizeStruct(&local_190,0x80,0x80,1);
  local_194 = 0x822e;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_194);
  pmVar1->xSize = local_190.xSize;
  pmVar1->ySize = local_190.ySize;
  pmVar1->zSize = local_190.zSize;
  PageSizeStruct::PageSizeStruct(&local_1a0,0x80,0x80,1);
  local_1a4 = 0x8c3a;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_1a4);
  pmVar1->xSize = local_1a0.xSize;
  pmVar1->ySize = local_1a0.ySize;
  pmVar1->zSize = local_1a0.zSize;
  PageSizeStruct::PageSizeStruct(&local_1b0,0x80,0x80,1);
  local_1b4 = 0x8c3d;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_1b4);
  pmVar1->xSize = local_1b0.xSize;
  pmVar1->ySize = local_1b0.ySize;
  pmVar1->zSize = local_1b0.zSize;
  PageSizeStruct::PageSizeStruct(&local_1c0,0x80,0x80,1);
  local_1c4 = 0x8235;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_1c4);
  pmVar1->xSize = local_1c0.xSize;
  pmVar1->ySize = local_1c0.ySize;
  pmVar1->zSize = local_1c0.zSize;
  PageSizeStruct::PageSizeStruct(&local_1d0,0x80,0x80,1);
  local_1d4 = 0x8236;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_1d4);
  pmVar1->xSize = local_1d0.xSize;
  pmVar1->ySize = local_1d0.ySize;
  pmVar1->zSize = local_1d0.zSize;
  PageSizeStruct::PageSizeStruct(&local_1e0,0x80,0x80,1);
  local_1e4 = 0x8239;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_1e4);
  pmVar1->xSize = local_1e0.xSize;
  pmVar1->ySize = local_1e0.ySize;
  pmVar1->zSize = local_1e0.zSize;
  PageSizeStruct::PageSizeStruct(&local_1f0,0x80,0x80,1);
  local_1f4 = 0x823a;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_1f4);
  pmVar1->xSize = local_1f0.xSize;
  pmVar1->ySize = local_1f0.ySize;
  pmVar1->zSize = local_1f0.zSize;
  PageSizeStruct::PageSizeStruct(&local_200,0x80,0x80,1);
  local_204 = 0x8d8e;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_204);
  pmVar1->xSize = local_200.xSize;
  pmVar1->ySize = local_200.ySize;
  pmVar1->zSize = local_200.zSize;
  PageSizeStruct::PageSizeStruct(&local_210,0x80,0x80,1);
  local_214 = 0x8d7c;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_214);
  pmVar1->xSize = local_210.xSize;
  pmVar1->ySize = local_210.ySize;
  pmVar1->zSize = local_210.zSize;
  PageSizeStruct::PageSizeStruct(&local_220,0x80,0x40,1);
  local_224 = 0x805b;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_224);
  pmVar1->xSize = local_220.xSize;
  pmVar1->ySize = local_220.ySize;
  pmVar1->zSize = local_220.zSize;
  PageSizeStruct::PageSizeStruct(&local_230,0x80,0x40,1);
  local_234 = 0x8f9b;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_234);
  pmVar1->xSize = local_230.xSize;
  pmVar1->ySize = local_230.ySize;
  pmVar1->zSize = local_230.zSize;
  PageSizeStruct::PageSizeStruct(&local_240,0x80,0x40,1);
  local_244 = 0x881a;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_244);
  pmVar1->xSize = local_240.xSize;
  pmVar1->ySize = local_240.ySize;
  pmVar1->zSize = local_240.zSize;
  PageSizeStruct::PageSizeStruct(&local_250,0x80,0x40,1);
  local_254 = 0x8230;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_254);
  pmVar1->xSize = local_250.xSize;
  pmVar1->ySize = local_250.ySize;
  pmVar1->zSize = local_250.zSize;
  PageSizeStruct::PageSizeStruct(&local_260,0x80,0x40,1);
  local_264 = 0x823b;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_264);
  pmVar1->xSize = local_260.xSize;
  pmVar1->ySize = local_260.ySize;
  pmVar1->zSize = local_260.zSize;
  PageSizeStruct::PageSizeStruct(&local_270,0x80,0x40,1);
  local_274 = 0x823c;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_274);
  pmVar1->xSize = local_270.xSize;
  pmVar1->ySize = local_270.ySize;
  pmVar1->zSize = local_270.zSize;
  PageSizeStruct::PageSizeStruct(&local_280,0x80,0x40,1);
  local_284 = 0x8d88;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_284);
  pmVar1->xSize = local_280.xSize;
  pmVar1->ySize = local_280.ySize;
  pmVar1->zSize = local_280.zSize;
  PageSizeStruct::PageSizeStruct(&local_290,0x80,0x40,1);
  local_294 = 0x8d76;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_294);
  pmVar1->xSize = local_290.xSize;
  pmVar1->ySize = local_290.ySize;
  pmVar1->zSize = local_290.zSize;
  PageSizeStruct::PageSizeStruct(&local_2a0,0x40,0x40,1);
  local_2a4 = 0x8814;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_2a4);
  pmVar1->xSize = local_2a0.xSize;
  pmVar1->ySize = local_2a0.ySize;
  pmVar1->zSize = local_2a0.zSize;
  PageSizeStruct::PageSizeStruct(&local_2b0,0x40,0x40,1);
  local_2b4 = 0x8d82;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_2b4);
  pmVar1->xSize = local_2b0.xSize;
  pmVar1->ySize = local_2b0.ySize;
  pmVar1->zSize = local_2b0.zSize;
  PageSizeStruct::PageSizeStruct(&local_2c0,0x40,0x40,1);
  local_2c4 = 0x8d70;
  pmVar1 = std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::operator[](&this->mStandardVirtualPageSizesTable,&local_2c4);
  pmVar1->xSize = local_2c0.xSize;
  pmVar1->ySize = local_2c0.ySize;
  pmVar1->zSize = local_2c0.zSize;
  return (int)pmVar1;
}

Assistant:

void StandardPageSizesTestCase::init()
{
	mSupportedTargets.push_back(GL_TEXTURE_1D);
	mSupportedTargets.push_back(GL_TEXTURE_1D_ARRAY);
	mSupportedTargets.push_back(GL_TEXTURE_2D);
	mSupportedTargets.push_back(GL_TEXTURE_2D_ARRAY);
	mSupportedTargets.push_back(GL_TEXTURE_CUBE_MAP);
	mSupportedTargets.push_back(GL_TEXTURE_CUBE_MAP_ARRAY);
	mSupportedTargets.push_back(GL_TEXTURE_RECTANGLE);
	mSupportedTargets.push_back(GL_TEXTURE_BUFFER);
	mSupportedTargets.push_back(GL_RENDERBUFFER);

	mStandardVirtualPageSizesTable[GL_R8]			  = PageSizeStruct(256, 256, 1);
	mStandardVirtualPageSizesTable[GL_R8_SNORM]		  = PageSizeStruct(256, 256, 1);
	mStandardVirtualPageSizesTable[GL_R8I]			  = PageSizeStruct(256, 256, 1);
	mStandardVirtualPageSizesTable[GL_R8UI]			  = PageSizeStruct(256, 256, 1);
	mStandardVirtualPageSizesTable[GL_R16]			  = PageSizeStruct(256, 128, 1);
	mStandardVirtualPageSizesTable[GL_R16_SNORM]	  = PageSizeStruct(256, 128, 1);
	mStandardVirtualPageSizesTable[GL_RG8]			  = PageSizeStruct(256, 128, 1);
	mStandardVirtualPageSizesTable[GL_RG8_SNORM]	  = PageSizeStruct(256, 128, 1);
	mStandardVirtualPageSizesTable[GL_RGB565]		  = PageSizeStruct(256, 128, 1);
	mStandardVirtualPageSizesTable[GL_R16F]			  = PageSizeStruct(256, 128, 1);
	mStandardVirtualPageSizesTable[GL_R16I]			  = PageSizeStruct(256, 128, 1);
	mStandardVirtualPageSizesTable[GL_R16UI]		  = PageSizeStruct(256, 128, 1);
	mStandardVirtualPageSizesTable[GL_RG8I]			  = PageSizeStruct(256, 128, 1);
	mStandardVirtualPageSizesTable[GL_RG8UI]		  = PageSizeStruct(256, 128, 1);
	mStandardVirtualPageSizesTable[GL_RG16]			  = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_RG16_SNORM]	 = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_RGBA8]		  = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_RGBA8_SNORM]	= PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_RGB10_A2]		  = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_RGB10_A2UI]	 = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_RG16F]		  = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_R32F]			  = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_R11F_G11F_B10F] = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_RGB9_E5]		  = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_R32I]			  = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_R32UI]		  = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_RG16I]		  = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_RG16UI]		  = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_RGBA8I]		  = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_RGBA8UI]		  = PageSizeStruct(128, 128, 1);
	mStandardVirtualPageSizesTable[GL_RGBA16]		  = PageSizeStruct(128, 64, 1);
	mStandardVirtualPageSizesTable[GL_RGBA16_SNORM]   = PageSizeStruct(128, 64, 1);
	mStandardVirtualPageSizesTable[GL_RGBA16F]		  = PageSizeStruct(128, 64, 1);
	mStandardVirtualPageSizesTable[GL_RG32F]		  = PageSizeStruct(128, 64, 1);
	mStandardVirtualPageSizesTable[GL_RG32I]		  = PageSizeStruct(128, 64, 1);
	mStandardVirtualPageSizesTable[GL_RG32UI]		  = PageSizeStruct(128, 64, 1);
	mStandardVirtualPageSizesTable[GL_RGBA16I]		  = PageSizeStruct(128, 64, 1);
	mStandardVirtualPageSizesTable[GL_RGBA16UI]		  = PageSizeStruct(128, 64, 1);
	mStandardVirtualPageSizesTable[GL_RGBA32F]		  = PageSizeStruct(64, 64, 1);
	mStandardVirtualPageSizesTable[GL_RGBA32I]		  = PageSizeStruct(64, 64, 1);
	mStandardVirtualPageSizesTable[GL_RGBA32UI]		  = PageSizeStruct(64, 64, 1);
}